

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

bool Game::addTileOnGameboard(GameBoard *gb)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  const_reference pvVar5;
  tile_t *ptVar6;
  point2D_t *pt;
  pointer ptVar7;
  pointer ptVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_list_of_free_tiles;
  undefined1 local_80 [16];
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_70;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_50;
  
  std::_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
  _Tuple_impl(&local_50,
              (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
               *)gb);
  index_list_of_free_tiles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  index_list_of_free_tiles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  index_list_of_free_tiles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptVar7 = (pointer)0x0;
  for (ptVar8 = local_50.
                super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
                super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>
                ._M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ptVar8 != local_50.
                super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
                super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>
                ._M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                _M_impl.super__Vector_impl_data._M_finish; ptVar8 = ptVar8 + 1) {
    if (ptVar8->value == 0) {
      local_70.super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
      super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
      _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&index_list_of_free_tiles,(unsigned_long *)(local_80 + 0x10));
    }
    ptVar7 = (pointer)((long)&ptVar7->value + 1);
  }
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_50);
  puVar3 = index_list_of_free_tiles.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = index_list_of_free_tiles.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index_list_of_free_tiles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      index_list_of_free_tiles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    ::_Tuple_impl((_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                   *)(local_80 + 0x10),
                  (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                   *)gb);
    std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
              ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)(local_80 + 0x10));
    anon_unknown_0::RandInt::RandInt((RandInt *)local_80);
    iVar4 = anon_unknown_0::RandInt::operator()((RandInt *)local_80);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&index_list_of_free_tiles,
                        (ulong)(long)iVar4 %
                        (ulong)((long)index_list_of_free_tiles.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)index_list_of_free_tiles.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    uVar1 = *pvVar5;
    anon_unknown_0::RandInt::RandInt((RandInt *)local_80);
    iVar4 = anon_unknown_0::RandInt::operator()((RandInt *)local_80);
    uVar1 = (ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
    pt = (point2D_t *)
         ((long)uVar1 % (long)(int)local_70.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl
         << 0x20);
    local_80._0_8_ =
         (long)uVar1 / (long)(int)local_70.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl
         & 0xffffffffU | (ulong)pt;
    ptVar6 = anon_unknown_0::gameboard_data_point_t::operator()
                       ((gameboard_data_point_t *)gb,(gameboard_data_array_t *)local_80,pt);
    ptVar6->value = (ulong)(0x59 < iVar4 % 100) * 2 + 2;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&index_list_of_free_tiles.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return puVar3 == puVar2;
}

Assistant:

bool addTileOnGameboard(GameBoard &gb) {
  return addTileOnGameboardDataArray(gb.gbda);
}